

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

PaError PaAlsaStreamComponent_BeginPolling(PaAlsaStreamComponent *self,pollfd *pfds)

{
  uint uVar1;
  
  uVar1 = snd_pcm_poll_descriptors(self->pcm,pfds,self->nfds);
  if (uVar1 == self->nfds) {
    self->ready = 0;
    return uVar1;
  }
  __assert_fail("ret == self->nfds",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                ,0xe34,
                "PaError PaAlsaStreamComponent_BeginPolling(PaAlsaStreamComponent *, struct pollfd *)"
               );
}

Assistant:

static PaError PaAlsaStreamComponent_BeginPolling( PaAlsaStreamComponent* self, struct pollfd* pfds )
{
    PaError result = paNoError;
    int ret = alsa_snd_pcm_poll_descriptors( self->pcm, pfds, self->nfds );
    (void)ret;  /* Prevent unused variable warning if asserts are turned off */
    assert( ret == self->nfds );

    self->ready = 0;

    return result;
}